

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_node_<true,false,true,double_const&>
          (Simplex_tree<MiniSTOptions> *this,Siblings *sib,Vertex_handle v,double *filtration_value)

{
  undefined6 in_register_00000012;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  *ret_val;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar1;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar2;
  undefined2 local_32;
  double local_30;
  short local_28 [4];
  __buckets_ptr local_20;
  char local_18;
  
  local_30 = (double)CONCAT62(in_register_00000012,v);
  local_32 = SUB82(filtration_value,0);
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  pVar1 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>>>
          ::
          try_emplace<short_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<MiniSTOptions>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>,std::less<short>,void>>*&,double_const&>
                    ((flat_tree<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>,boost::container::dtl::select1st<short>,std::less<short>,boost::container::new_allocator<boost::container::dtl::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>>>>>
                      *)&local_20,(const_iterator *)((long)local_30 + 0x10),local_28,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<MiniSTOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>,_std::less<short>,_void>_>
                      **)&local_32,&local_30);
  pVar2._8_8_ = pVar1._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_20;
  *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_18;
  if (local_18 == '\0') {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
  }
  pVar2.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar2;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }